

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderRenderCase.cpp
# Opt level: O0

void __thiscall
deqp::ShaderRenderCase::computeVertexReference
          (ShaderRenderCase *this,Surface *result,QuadGrid *quadGrid)

{
  Vec4 *pVVar1;
  Vec4 *pVVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  deInt32 dVar8;
  deInt32 dVar9;
  RGBA col;
  undefined4 extraout_var;
  PixelFormat *pPVar10;
  float *pfVar11;
  reference pvVar12;
  undefined4 extraout_var_00;
  int iVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float s;
  Vector<float,_4> VVar19;
  float *local_428;
  Vector<float,_4> local_3c8;
  Vector<float,_4> local_3b8;
  Vector<float,_4> local_3a8;
  Vector<float,_4> local_398;
  Vector<float,_4> local_388;
  undefined1 local_378 [8];
  Vec4 color_1;
  Vec4 *t2;
  Vec4 *t1;
  Vec4 *t0;
  float ty;
  float tx;
  bool tri;
  float fy1;
  float fx1;
  float sfy;
  float sfx;
  int ix;
  int iy;
  Vec4 c11;
  Vec4 c10;
  Vec4 c01;
  Vec4 c00;
  int v11;
  int v10;
  int v01;
  int v00;
  int iy1;
  int iy0;
  int ix1;
  int ix0;
  float oosy;
  float oosx;
  float sy1;
  float sy0;
  float sx1;
  float sx0;
  float y1;
  float y0;
  float x1;
  float x0;
  int x_1;
  int y_1;
  Vec4 color;
  int vtxNdx;
  float sy;
  float sx;
  int x;
  int y;
  allocator<tcu::Vector<float,_4>_> local_261;
  undefined1 local_260 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colors;
  ShaderEvalContext evalCtx;
  bool hasAlpha;
  int stride;
  int gridSize;
  int height;
  int width;
  QuadGrid *quadGrid_local;
  Surface *result_local;
  ShaderRenderCase *this_local;
  
  iVar3 = tcu::Surface::getWidth(result);
  iVar4 = tcu::Surface::getHeight(result);
  iVar5 = QuadGrid::getGridSize(quadGrid);
  iVar13 = iVar5 + 1;
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar10 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var,iVar6));
  evalCtx.quadGrid._7_1_ = 0 < pPVar10->alphaBits;
  ShaderEvalContext::ShaderEvalContext
            ((ShaderEvalContext *)
             &colors.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,quadGrid);
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_261);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_260,
             (long)((iVar5 + 1) * (iVar5 + 1)),&local_261);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_261);
  for (sx = 0.0; (int)sx < iVar5 + 1; sx = (float)((int)sx + 1)) {
    for (sy = 0.0; (int)sy < iVar5 + 1; sy = (float)((int)sy + 1)) {
      color.m_data[3] = (float)(int)sx / (float)iVar5;
      color.m_data[2] = (float)((int)sx * (iVar5 + 1) + (int)sy);
      ShaderEvalContext::reset
                ((ShaderEvalContext *)
                 &colors.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(float)(int)sy / (float)iVar5,
                 color.m_data[3]);
      (*this->m_evaluator->_vptr_ShaderEvaluator[2])
                (this->m_evaluator,
                 &colors.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)&x_1,(Vector<float,_4> *)&evalCtx.textures[3].tex3D);
      if ((evalCtx.quadGrid._7_1_ & 1) == 0) {
        pfVar11 = tcu::Vector<float,_4>::w((Vector<float,_4> *)&x_1);
        *pfVar11 = 1.0;
      }
      pvVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_260,(long)(int)color.m_data[2]);
      *(undefined8 *)pvVar12->m_data = _x_1;
      *(undefined8 *)(pvVar12->m_data + 2) = color.m_data._0_8_;
    }
  }
  for (x0 = 0.0; (int)x0 < iVar5; x0 = (float)((int)x0 + 1)) {
    for (x1 = 0.0; (int)x1 < iVar5; x1 = (float)((int)x1 + 1)) {
      fVar14 = ((float)(int)x1 / (float)iVar5) * (float)iVar3;
      fVar15 = ((float)((int)x1 + 1) / (float)iVar5) * (float)iVar3;
      fVar16 = ((float)(int)x0 / (float)iVar5) * (float)iVar4;
      fVar17 = ((float)((int)x0 + 1) / (float)iVar5) * (float)iVar4;
      fVar7 = (float)::deCeilFloatToInt32(fVar14 + -0.5);
      dVar8 = ::deCeilFloatToInt32(fVar15 + -0.5);
      sfx = (float)::deCeilFloatToInt32(fVar16 + -0.5);
      dVar9 = ::deCeilFloatToInt32(fVar17 + -0.5);
      pvVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_260,(long)((int)x0 * iVar13 + (int)x1));
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(c01.m_data + 2),pvVar12);
      pvVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_260,(long)((int)x0 * iVar13 + 1 + (int)x1));
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(c10.m_data + 2),pvVar12);
      pvVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_260,(long)(((int)x0 + 1) * iVar13 + (int)x1));
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(c11.m_data + 2),pvVar12);
      pvVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_260,(long)(((int)x0 + 1) * iVar13 + 1 + (int)x1));
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&ix,pvVar12);
      for (; sfy = fVar7, (int)sfx < dVar9; sfx = (float)((int)sfx + 1)) {
        for (; (int)sfy < dVar8; sfy = (float)((int)sfy + 1)) {
          fVar18 = deFloatClamp((((float)(int)sfy + 0.5) - fVar14) * (1.0 / (fVar15 - fVar14)),0.0,
                                1.0);
          s = deFloatClamp((((float)(int)sfx + 0.5) - fVar16) * (1.0 / (fVar17 - fVar16)),0.0,1.0);
          if (1.0 < fVar18 + s) {
            fVar18 = 1.0 - fVar18;
            s = 1.0 - s;
            pfVar11 = (float *)&ix;
            pVVar1 = &c11;
            pVVar2 = &c10;
          }
          else {
            pfVar11 = c01.m_data + 2;
            pVVar1 = &c10;
            pVVar2 = &c11;
          }
          local_428 = pVVar2->m_data + 2;
          color_1.m_data._8_8_ = local_428;
          tcu::operator-((tcu *)&local_3a8,(Vector<float,_4> *)(pVVar1->m_data + 2),
                         (Vector<float,_4> *)pfVar11);
          tcu::operator*((tcu *)&local_398,&local_3a8,fVar18);
          tcu::operator+((tcu *)&local_388,(Vector<float,_4> *)pfVar11,&local_398);
          tcu::operator-((tcu *)&local_3c8,(Vector<float,_4> *)color_1.m_data._8_8_,
                         (Vector<float,_4> *)pfVar11);
          tcu::operator*((tcu *)&local_3b8,&local_3c8,s);
          VVar19 = tcu::operator+((tcu *)local_378,&local_388,&local_3b8);
          iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])
                            (VVar19.m_data._0_8_,VVar19.m_data._8_8_);
          pPVar10 = tcu::RenderTarget::getPixelFormat
                              ((RenderTarget *)CONCAT44(extraout_var_00,iVar6));
          if (pPVar10->alphaBits == 1) {
            pfVar11 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_378);
            fVar18 = deFloatRound(*pfVar11);
            pfVar11 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_378);
            *pfVar11 = fVar18;
          }
          col = toRGBA((Vec4 *)local_378);
          tcu::Surface::setPixel(result,(int)sfy,(int)sfx,col);
        }
      }
    }
  }
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_260);
  ShaderEvalContext::~ShaderEvalContext
            ((ShaderEvalContext *)
             &colors.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void ShaderRenderCase::computeVertexReference(Surface& result, const QuadGrid& quadGrid)
{
	// Buffer info.
	int				  width	= result.getWidth();
	int				  height   = result.getHeight();
	int				  gridSize = quadGrid.getGridSize();
	int				  stride   = gridSize + 1;
	bool			  hasAlpha = m_renderCtx.getRenderTarget().getPixelFormat().alphaBits > 0;
	ShaderEvalContext evalCtx(quadGrid);

	// Evaluate color for each vertex.
	vector<Vec4> colors((gridSize + 1) * (gridSize + 1));
	for (int y = 0; y < gridSize + 1; y++)
		for (int x = 0; x < gridSize + 1; x++)
		{
			float sx	 = static_cast<float>(x) / static_cast<float>(gridSize);
			float sy	 = static_cast<float>(y) / static_cast<float>(gridSize);
			int   vtxNdx = ((y * (gridSize + 1)) + x);

			evalCtx.reset(sx, sy);
			m_evaluator.evaluate(evalCtx);
			DE_ASSERT(!evalCtx.isDiscarded); // Discard is not available in vertex shader.
			Vec4 color = evalCtx.color;

			if (!hasAlpha)
				color.w() = 1.0f;

			colors[vtxNdx] = color;
		}

	// Render quads.
	for (int y = 0; y < gridSize; y++)
		for (int x = 0; x < gridSize; x++)
		{
			float x0 = static_cast<float>(x) / static_cast<float>(gridSize);
			float x1 = static_cast<float>(x + 1) / static_cast<float>(gridSize);
			float y0 = static_cast<float>(y) / static_cast<float>(gridSize);
			float y1 = static_cast<float>(y + 1) / static_cast<float>(gridSize);

			float sx0  = x0 * (float)width;
			float sx1  = x1 * (float)width;
			float sy0  = y0 * (float)height;
			float sy1  = y1 * (float)height;
			float oosx = 1.0f / (sx1 - sx0);
			float oosy = 1.0f / (sy1 - sy0);

			int ix0 = deCeilFloatToInt32(sx0 - 0.5f);
			int ix1 = deCeilFloatToInt32(sx1 - 0.5f);
			int iy0 = deCeilFloatToInt32(sy0 - 0.5f);
			int iy1 = deCeilFloatToInt32(sy1 - 0.5f);

			int  v00 = (y * stride) + x;
			int  v01 = (y * stride) + x + 1;
			int  v10 = ((y + 1) * stride) + x;
			int  v11 = ((y + 1) * stride) + x + 1;
			Vec4 c00 = colors[v00];
			Vec4 c01 = colors[v01];
			Vec4 c10 = colors[v10];
			Vec4 c11 = colors[v11];

			//printf("(%d,%d) -> (%f..%f, %f..%f) (%d..%d, %d..%d)\n", x, y, sx0, sx1, sy0, sy1, ix0, ix1, iy0, iy1);

			for (int iy = iy0; iy < iy1; iy++)
				for (int ix = ix0; ix < ix1; ix++)
				{
					DE_ASSERT(deInBounds32(ix, 0, width));
					DE_ASSERT(deInBounds32(iy, 0, height));

					float sfx = (float)ix + 0.5f;
					float sfy = (float)iy + 0.5f;
					float fx1 = deFloatClamp((sfx - sx0) * oosx, 0.0f, 1.0f);
					float fy1 = deFloatClamp((sfy - sy0) * oosy, 0.0f, 1.0f);

					// Triangle quad interpolation.
					bool		tri   = fx1 + fy1 <= 1.0f;
					float		tx	= tri ? fx1 : (1.0f - fx1);
					float		ty	= tri ? fy1 : (1.0f - fy1);
					const Vec4& t0	= tri ? c00 : c11;
					const Vec4& t1	= tri ? c01 : c10;
					const Vec4& t2	= tri ? c10 : c01;
					Vec4		color = t0 + (t1 - t0) * tx + (t2 - t0) * ty;

					// Quantizing for 1-bit alpha
					if ((m_renderCtx.getRenderTarget().getPixelFormat().alphaBits) == 1)
						color.w() = deFloatRound(color.w());

					result.setPixel(ix, iy, toRGBA(color));
				}
		}
}